

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstexprConstructor
          (MessageGenerator *this,Printer *p)

{
  Options *options;
  Descriptor *desc;
  Printer *pPVar1;
  bool bVar2;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  allocator<char> local_2c1;
  Printer *p_local;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [8];
  undefined8 uStack_238;
  variant<std::__cxx11::string,std::function<bool()>> local_230 [32];
  char local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8;
  undefined1 local_1a0;
  string local_198;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  c;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Formatter format;
  Options local_108;
  
  options = &this->options_;
  p_local = p;
  bVar2 = ShouldGenerateClass(this->descriptor_,options);
  if (bVar2) {
    desc = this->descriptor_;
    Options::Options(&local_108,options);
    cpp::anon_unknown_0::ClassVars
              ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)&local_250,desc,&local_108);
    vars.len_ = (long)(local_250._8_8_ - local_250._0_8_) / 0xb8;
    vars.ptr_ = (pointer)local_250._M_allocated_capacity;
    io::Printer::WithVars(&v,p,vars);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&local_250);
    Options::~Options(&local_108);
    pPVar1 = p_local;
    MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&local_250,this->descriptor_,options);
    vars_00.len_ = (long)(local_250._8_8_ - local_250._0_8_) / 0xb8;
    vars_00.ptr_ = (pointer)local_250._M_allocated_capacity;
    io::Printer::WithVars(&t,pPVar1,vars_00);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&local_250);
    pPVar1 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"constexpr",(allocator<char> *)&format);
    io::Printer::Sub::Sub<char_const(&)[19]>
              ((Sub *)&local_250,&local_198,(char (*) [19])"PROTOBUF_CONSTEXPR");
    vars_01.len_ = 1;
    vars_01.ptr_ = (pointer)&local_250;
    io::Printer::WithVars(&c,pPVar1,vars_01);
    io::Printer::Sub::~Sub((Sub *)&local_250);
    std::__cxx11::string::~string((string *)&local_198);
    format.printer_ = p_local;
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    if (((this->descriptor_->options_->field_0)._impl_.map_entry_ == false) &&
       (bVar2 = HasImplData(this->descriptor_,options), bVar2)) {
      io::Printer::Emit(p_local,1,"\n");
      pPVar1 = p_local;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"init",&local_2c1);
      local_250._M_allocated_capacity = (size_type)local_240;
      if (local_2b8 == local_2a8) {
        uStack_238 = uStack_2a0;
      }
      else {
        local_250._M_allocated_capacity = (size_type)local_2b8;
      }
      local_250._8_8_ = local_2b0;
      local_2b0 = 0;
      local_2a8[0] = 0;
      local_268 = (code *)0x0;
      pcStack_260 = (code *)0x0;
      local_278._M_unused._M_object = (void *)0x0;
      local_278._8_8_ = 0;
      local_2b8 = local_2a8;
      local_278._M_unused._M_object = operator_new(0x18);
      *(MessageGenerator **)local_278._M_unused._0_8_ = this;
      *(Printer ***)((long)local_278._M_unused._0_8_ + 8) = &p_local;
      *(undefined1 *)((long)local_278._M_unused._0_8_ + 0x10) = 0;
      pcStack_260 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_268 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_230,(function<bool_()> *)&local_278);
      std::_Function_base::~_Function_base((_Function_base *)&local_278);
      local_208 = &local_1f8;
      local_200 = 0;
      local_1f8._M_local_buf[0] = '\0';
      local_1e8 = 0;
      if (local_210 == '\x01') {
        std::__cxx11::string::assign((char *)&local_208);
      }
      local_1a0 = 0;
      io::Printer::Emit(pPVar1,&local_250,1,0xa7,
                        "\n            inline constexpr $classname$::Impl_::Impl_(\n                ::_pbi::ConstantInitialized) noexcept\n                //~\n                $init$ {}\n          "
                       );
      io::Printer::Sub::~Sub((Sub *)&local_250);
      std::__cxx11::string::~string((string *)&local_2b8);
      io::Printer::Emit(p_local,1,"\n");
      io::Printer::Emit(p_local,0x16f,
                        "\n        template <typename>\n        $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n            : $superclass$($classname$_class_data_.base()),\n#else   // PROTOBUF_CUSTOM_VTABLE\n            : $superclass$(),\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              _impl_(::_pbi::ConstantInitialized()) {\n        }\n      "
                       );
    }
    else {
      pPVar1 = p_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_298._M_local_buf,"base",&local_2c1);
      local_250._M_allocated_capacity = (size_type)local_240;
      if ((undefined1 *)local_298._M_allocated_capacity == local_288) {
        uStack_238 = uStack_280;
      }
      else {
        local_250._M_allocated_capacity = local_298._M_allocated_capacity;
      }
      local_250._8_8_ = local_298._8_8_;
      local_298._8_8_ = 0;
      local_288[0] = 0;
      local_268 = (code *)0x0;
      pcStack_260 = (code *)0x0;
      local_278._M_unused._M_object = (void *)0x0;
      local_278._8_8_ = 0;
      local_298._M_allocated_capacity = (size_type)local_288;
      local_278._M_unused._M_object = operator_new(0x18);
      *(MessageGenerator **)local_278._M_unused._0_8_ = this;
      *(Printer ***)((long)local_278._M_unused._0_8_ + 8) = &p_local;
      *(undefined1 *)((long)local_278._M_unused._0_8_ + 0x10) = 0;
      pcStack_260 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_268 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_230,(function<bool_()> *)&local_278);
      std::_Function_base::~_Function_base((_Function_base *)&local_278);
      local_208 = &local_1f8;
      local_200 = 0;
      local_1f8._M_local_buf[0] = '\0';
      local_1e8 = 0;
      if (local_210 == '\x01') {
        std::__cxx11::string::assign((char *)&local_208);
      }
      local_1a0 = 0;
      io::Printer::Emit(pPVar1,&local_250,1,0x1d1,
                        "\n              //~ Templatize constexpr constructor as a workaround for a bug in\n              //~ gcc 12 (warning in gcc 13).\n              template <typename>\n              $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                  : $base$($classname$_class_data_.base()){}\n#else   // PROTOBUF_CUSTOM_VTABLE\n                  : $base$() {\n              }\n#endif  // PROTOBUF_CUSTOM_VTABLE\n            "
                       );
      io::Printer::Sub::~Sub((Sub *)&local_250);
      std::__cxx11::string::~string((string *)local_298._M_local_buf);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&format.vars_);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&c);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&t);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&v);
    return;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateConstexprConstructor(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  auto c = p->WithVars({{"constexpr", "PROTOBUF_CONSTEXPR"}});
  Formatter format(p);

  if (IsMapEntryMessage(descriptor_) || !HasImplData(descriptor_, options_)) {
    p->Emit({{"base",
              [&] {
                if (IsMapEntryMessage(descriptor_)) {
                  p->Emit("$classname$::MapEntry");
                } else {
                  p->Emit("$superclass$");
                }
              }}},
            R"cc(
              //~ Templatize constexpr constructor as a workaround for a bug in
              //~ gcc 12 (warning in gcc 13).
              template <typename>
              $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)
#if defined(PROTOBUF_CUSTOM_VTABLE)
                  : $base$($classname$_class_data_.base()){}
#else   // PROTOBUF_CUSTOM_VTABLE
                  : $base$() {
              }
#endif  // PROTOBUF_CUSTOM_VTABLE
            )cc");
    return;
  }

  // Generate Impl_::Imp_(::_pbi::ConstantInitialized);
  // We use separate p->Emit() calls for LF and #ifdefs as they result in
  // awkward layout and more awkward indenting of the function statement.
  p->Emit("\n");
  p->Emit({{"init", [&] { GenerateImplMemberInit(p, InitType::kConstexpr); }}},
          R"cc(
            inline constexpr $classname$::Impl_::Impl_(
                ::_pbi::ConstantInitialized) noexcept
                //~
                $init$ {}
          )cc");
  p->Emit("\n");

  p->Emit(
      R"cc(
        template <typename>
        $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)
#if defined(PROTOBUF_CUSTOM_VTABLE)
            : $superclass$($classname$_class_data_.base()),
#else   // PROTOBUF_CUSTOM_VTABLE
            : $superclass$(),
#endif  // PROTOBUF_CUSTOM_VTABLE
              _impl_(::_pbi::ConstantInitialized()) {
        }
      )cc");
}